

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O3

void __thiscall Assimp::ColladaParser::ReadContents(ColladaParser *this)

{
  int iVar1;
  uint uVar2;
  undefined4 extraout_var;
  Logger *pLVar3;
  undefined4 extraout_var_00;
  ostream *poVar4;
  char *pcVar5;
  FormatVersion FVar6;
  char *message;
  char *local_1d0;
  long *local_1c8;
  long local_1b8 [2];
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> local_1a8 [112];
  ios_base local_138 [264];
  undefined4 extraout_var_01;
  
  iVar1 = (*this->mReader->_vptr_IIrrXMLReader[2])();
  if ((char)iVar1 != '\0') {
    do {
      iVar1 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      if (iVar1 == 1) {
        iVar1 = (*this->mReader->_vptr_IIrrXMLReader[3])();
        if (iVar1 != 1) {
          __assert_fail("mReader->getNodeType() == irr::io::EXN_ELEMENT",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Collada/ColladaParser.h"
                        ,0x178,"bool Assimp::ColladaParser::IsElement(const char *) const");
        }
        iVar1 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
        iVar1 = strcmp((char *)CONCAT44(extraout_var,iVar1),"COLLADA");
        if (iVar1 == 0) {
          uVar2 = TestAttribute(this,"version");
          if (uVar2 != 0xffffffff) {
            iVar1 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)uVar2);
            pcVar5 = (char *)CONCAT44(extraout_var_01,iVar1);
            if (*pcVar5 == '1') {
              if (pcVar5[1] == '.') {
                FVar6 = FV_1_5_n;
                message = "Collada schema version is 1.5.n";
                if (pcVar5[2] != '5') goto LAB_003fa85f;
LAB_003fa88f:
                this->mFormat = FVar6;
                pLVar3 = DefaultLogger::get();
                Logger::debug(pLVar3,message);
              }
              else {
LAB_003fa85f:
                if (pcVar5[1] == '.') {
                  FVar6 = FV_1_4_n;
                  message = "Collada schema version is 1.4.n";
                  if (pcVar5[2] == '4') goto LAB_003fa88f;
                }
                if (pcVar5[1] == '.') {
                  FVar6 = FV_1_3_n;
                  message = "Collada schema version is 1.3.n";
                  if (pcVar5[2] == '3') goto LAB_003fa88f;
                }
              }
            }
          }
          ReadStructure(this);
        }
        else {
          pLVar3 = DefaultLogger::get();
          Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
          basic_formatter<char[26]>
                    ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_1a8,(char (*) [26])"Ignoring global element <");
          iVar1 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
          local_1d0 = (char *)CONCAT44(extraout_var_00,iVar1);
          poVar4 = (ostream *)
                   Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                   operator_(local_1a8,&local_1d0);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,">.",2);
          std::__cxx11::stringbuf::str();
          Logger::debug(pLVar3,(char *)local_1c8);
          if (local_1c8 != local_1b8) {
            operator_delete(local_1c8,local_1b8[0] + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
          SkipElement(this);
        }
      }
      iVar1 = (*this->mReader->_vptr_IIrrXMLReader[2])();
    } while ((char)iVar1 != '\0');
  }
  return;
}

Assistant:

void ColladaParser::ReadContents()
{
    while (mReader->read())
    {
        // handle the root element "COLLADA"
        if (mReader->getNodeType() == irr::io::EXN_ELEMENT)
        {
            if (IsElement("COLLADA"))
            {
                // check for 'version' attribute
                const int attrib = TestAttribute("version");
                if (attrib != -1) {
                    const char* version = mReader->getAttributeValue(attrib);

                    if (!::strncmp(version, "1.5", 3)) {
                        mFormat = FV_1_5_n;
                        ASSIMP_LOG_DEBUG("Collada schema version is 1.5.n");
                    }
                    else if (!::strncmp(version, "1.4", 3)) {
                        mFormat = FV_1_4_n;
                        ASSIMP_LOG_DEBUG("Collada schema version is 1.4.n");
                    }
                    else if (!::strncmp(version, "1.3", 3)) {
                        mFormat = FV_1_3_n;
                        ASSIMP_LOG_DEBUG("Collada schema version is 1.3.n");
                    }
                }

                ReadStructure();
            }
            else
            {
                ASSIMP_LOG_DEBUG_F("Ignoring global element <", mReader->getNodeName(), ">.");
                SkipElement();
            }
        }
        else
        {
            // skip everything else silently
        }
    }
}